

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

QStringList * QFontDatabase::applicationFontFamilies(int id)

{
  bool bVar1;
  QFontDatabasePrivate *this;
  iterator o;
  ApplicationFont *in_RDI;
  long in_FS_OFFSET;
  Properties *properties;
  QList<QFontDatabasePrivate::ApplicationFont::Properties> *__range1;
  QFontDatabasePrivate *d;
  QStringList *ret;
  iterator __end1;
  iterator __begin1;
  QMutexLocker<QRecursiveMutex> locker;
  QRecursiveMutex *in_stack_fffffffffffffef8;
  ApplicationFont *this_00;
  qsizetype in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 uVar2;
  iterator local_b0 [3];
  qsizetype in_stack_ffffffffffffff68;
  QList<QFontDatabasePrivate::ApplicationFont::Properties> QStack_30;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>::operator()
            ((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_fontDatabaseMutex>_>
              *)in_stack_fffffffffffffef8);
  QMutexLocker<QRecursiveMutex>::QMutexLocker
            ((QMutexLocker<QRecursiveMutex> *)this_00,in_stack_fffffffffffffef8);
  this = QFontDatabasePrivate::instance();
  uVar2 = 0;
  (in_RDI->fileName).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->fileName).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->fileName).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QString>::QList((QList<QString> *)0x7470d5);
  QList<QFontDatabasePrivate::ApplicationFont>::value
            ((QList<QFontDatabasePrivate::ApplicationFont> *)
             CONCAT17(uVar2,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18);
  QList<QFontDatabasePrivate::ApplicationFont::Properties>::size(&QStack_30);
  QList<QString>::reserve((QList<QString> *)this,in_stack_ffffffffffffff68);
  QFontDatabasePrivate::ApplicationFont::~ApplicationFont(this_00);
  QList<QFontDatabasePrivate::ApplicationFont>::value
            ((QList<QFontDatabasePrivate::ApplicationFont> *)
             CONCAT17(uVar2,in_stack_ffffffffffffff20),-0x5555555555555556);
  local_b0[0].i = (Properties *)&DAT_aaaaaaaaaaaaaaaa;
  local_b0[0] = QList<QFontDatabasePrivate::ApplicationFont::Properties>::begin
                          ((QList<QFontDatabasePrivate::ApplicationFont::Properties> *)this_00);
  o = QList<QFontDatabasePrivate::ApplicationFont::Properties>::end
                ((QList<QFontDatabasePrivate::ApplicationFont::Properties> *)this_00);
  while (bVar1 = QList<QFontDatabasePrivate::ApplicationFont::Properties>::iterator::operator!=
                           (local_b0,o), bVar1) {
    QList<QFontDatabasePrivate::ApplicationFont::Properties>::iterator::operator*(local_b0);
    QList<QString>::append((QList<QString> *)this_00,(parameter_type)in_stack_fffffffffffffef8);
    QList<QFontDatabasePrivate::ApplicationFont::Properties>::iterator::operator++(local_b0);
  }
  QFontDatabasePrivate::ApplicationFont::~ApplicationFont(this_00);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker((QMutexLocker<QRecursiveMutex> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QStringList *)this_00;
}

Assistant:

QStringList QFontDatabase::applicationFontFamilies(int id)
{
    QMutexLocker locker(fontDatabaseMutex());
    auto *d = QFontDatabasePrivate::instance();

    QStringList ret;
    ret.reserve(d->applicationFonts.value(id).properties.size());

    for (const auto &properties : d->applicationFonts.value(id).properties)
        ret.append(properties.familyName);

    return ret;
}